

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O3

SpectrumTextureHandle __thiscall
pbrt::SpectrumScaledTexture::Create
          (SpectrumScaledTexture *this,Transform *renderFromTexture,
          TextureParameterDictionary *parameters,FileLoc *loc,Allocator alloc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 uVar2;
  int iVar3;
  uintptr_t iptr_1;
  undefined4 extraout_var;
  ulong *puVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  uintptr_t iptr;
  float fVar7;
  Float cs;
  string ret;
  SpectrumTextureHandle tex;
  FloatTextureHandle scale;
  float local_74;
  string local_70;
  undefined1 local_50 [16];
  ParameterDictionary *local_40;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle>_>_>
  *local_38;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  iVar3 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,4,4);
  paVar1 = &local_70.field_2;
  *(undefined4 *)CONCAT44(extraout_var,iVar3) = 0x3f800000;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"tex","");
  local_38 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle>_>_>
              *)(CONCAT44(extraout_var,iVar3) | 0x1000000000000);
  TextureParameterDictionary::GetSpectrumTexture
            ((TextureParameterDictionary *)local_50,(string *)parameters,(SpectrumHandle *)&local_70
             ,(SpectrumType)&local_38,(Allocator)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"scale","");
  TextureParameterDictionary::GetFloatTexture
            ((TextureParameterDictionary *)&local_40,(string *)parameters,1.0,
             (memory_resource *)&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  if ((float *)((ulong)local_40 & 0xffffffffffff) != (float *)0x0 &&
      (short)((ulong)local_40 >> 0x30) == 5) {
    local_74 = *(float *)((ulong)local_40 & 0xffffffffffff);
    if ((local_74 == 1.0) && (!NAN(local_74))) {
      if (LOGGING_LogLevel < 1) {
        Log(Verbose,
            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/textures.cpp"
            ,0x329,"Dropping useless scale by 1");
      }
      (this->tex).
      super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
      .bits = local_50._0_8_;
      return (SpectrumTextureHandle)
             (TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
              )this;
    }
    puVar6 = (undefined8 *)(local_50._0_8_ & 0xffffffffffff);
    if (puVar6 != (undefined8 *)0x0 && (local_50._0_8_ & 0xffff000000000000) == 0x3000000000000) {
      local_50._12_4_ = local_74;
      iVar3 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x18,8);
      puVar5 = (undefined8 *)CONCAT44(extraout_var_01,iVar3);
      *puVar5 = 0;
      *puVar5 = *puVar6;
      uVar2 = puVar6[2];
      puVar5[1] = puVar6[1];
      puVar5[2] = uVar2;
      fVar7 = (float)local_50._12_4_;
      if (LOGGING_LogLevel < 1) {
        local_70._M_string_length = 0;
        local_70.field_2._M_local_buf[0] = '\0';
        local_70._M_dataplus._M_p = (pointer)paVar1;
        detail::stringPrintfRecursive<float&>
                  (&local_70,"Flattened scale %f * image texture",&local_74);
        Log(Verbose,
            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/textures.cpp"
            ,0x32f,local_70._M_dataplus._M_p);
        fVar7 = local_74;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != paVar1) {
          operator_delete(local_70._M_dataplus._M_p,
                          CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                                   local_70.field_2._M_local_buf[0]) + 1);
          fVar7 = local_74;
        }
      }
      *(float *)(puVar5 + 1) = fVar7 * *(float *)(puVar5 + 1);
      (this->tex).
      super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
      .bits = (ulong)puVar5 | 0x3000000000000;
      return (SpectrumTextureHandle)
             (TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
              )this;
    }
  }
  iVar3 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x10,8);
  puVar4 = (ulong *)CONCAT44(extraout_var_00,iVar3);
  *puVar4 = local_50._0_8_;
  puVar4[1] = (ulong)local_40;
  (this->tex).
  super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
  .bits = (ulong)puVar4 | 0x6000000000000;
  return (SpectrumTextureHandle)
         (TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
          )this;
}

Assistant:

SpectrumTextureHandle SpectrumScaledTexture::Create(
    const Transform &renderFromTexture, const TextureParameterDictionary &parameters,
    const FileLoc *loc, Allocator alloc) {
    SpectrumHandle one = alloc.new_object<ConstantSpectrum>(1.);
    SpectrumTextureHandle tex =
        parameters.GetSpectrumTexture("tex", one, SpectrumType::Reflectance, alloc);
    FloatTextureHandle scale = parameters.GetFloatTexture("scale", 1.f, alloc);

    if (FloatConstantTexture *cscale = scale.CastOrNullptr<FloatConstantTexture>()) {
        Float cs = cscale->Evaluate({});
        if (cs == 1) {
            LOG_VERBOSE("Dropping useless scale by 1");
            return tex;
        } else if (SpectrumImageTexture *image =
                       tex.CastOrNullptr<SpectrumImageTexture>()) {
            SpectrumImageTexture *imageCopy =
                alloc.new_object<SpectrumImageTexture>(*image);
            LOG_VERBOSE("Flattened scale %f * image texture", cs);
            imageCopy->scale *= cs;
            return imageCopy;
        }
#if defined(PBRT_BUILD_GPU_RENDERER)
        else if (GPUSpectrumImageTexture *gimage =
                     tex.CastOrNullptr<GPUSpectrumImageTexture>()) {
            GPUSpectrumImageTexture *gimageCopy =
                alloc.new_object<GPUSpectrumImageTexture>(*gimage);
            LOG_VERBOSE("Flattened scale %f * gpu image texture", cs);
            gimageCopy->scale *= cs;
            return gimageCopy;
        }
#endif
    }

    return alloc.new_object<SpectrumScaledTexture>(tex, scale);
}